

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuInfo.cpp
# Opt level: O0

void __thiscall primesieve::CpuInfo::CpuInfo(CpuInfo *this)

{
  EVP_PKEY_CTX *in_RSI;
  CpuInfo *in_RDI;
  exception *e;
  
  in_RDI->cpuCores_ = 0;
  in_RDI->cpuThreads_ = 0;
  in_RDI->threadsPerCore_ = 0;
  in_RDI->sysctlL2CacheWorkaround_ = false;
  (in_RDI->cacheSizes_)._M_elems[2] = 0;
  (in_RDI->cacheSizes_)._M_elems[3] = 0;
  (in_RDI->cacheSizes_)._M_elems[0] = 0;
  (in_RDI->cacheSizes_)._M_elems[1] = 0;
  (in_RDI->cacheSizes_)._M_elems[2] = 0;
  (in_RDI->cacheSizes_)._M_elems[3] = 0;
  (in_RDI->cacheSizes_)._M_elems[0] = 0;
  (in_RDI->cacheSizes_)._M_elems[1] = 0;
  (in_RDI->cacheSharing_)._M_elems[2] = 0;
  (in_RDI->cacheSharing_)._M_elems[3] = 0;
  (in_RDI->cacheSharing_)._M_elems[0] = 0;
  (in_RDI->cacheSharing_)._M_elems[1] = 0;
  (in_RDI->cacheSharing_)._M_elems[2] = 0;
  (in_RDI->cacheSharing_)._M_elems[3] = 0;
  (in_RDI->cacheSharing_)._M_elems[0] = 0;
  (in_RDI->cacheSharing_)._M_elems[1] = 0;
  std::__cxx11::string::string((string *)&in_RDI->error_);
  init(in_RDI,in_RSI);
  return;
}

Assistant:

CpuInfo::CpuInfo() :
  cpuCores_(0),
  cpuThreads_(0),
  threadsPerCore_(0),
  sysctlL2CacheWorkaround_(false),
  cacheSizes_{0, 0, 0, 0},
  cacheSharing_{0, 0, 0, 0}
{
  try
  {
    init();
  }
  catch (exception& e)
  {
    // We don't trust the operating system to reliably report
    // all CPU information. In case an unexpected error
    // occurs we continue without relying on CpuInfo and
    // primesieve will fallback to using default CPU settings
    // e.g. 32 KiB L1 data cache size.
    error_ = e.what();
  }
}